

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O3

Quaternion * __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::computeQuaternion_
          (Quaternion *__return_storage_ptr__,StableIMUFixedContactDynamicalSystem *this,Vector3 *x)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double local_40;
  double local_28;
  double dStack_20;
  
  dVar4 = (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
          m_storage.m_data.array[0];
  if ((dVar4 == (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                array[0]) &&
     (!NAN(dVar4) &&
      !NAN((x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [0]))) {
    dVar4 = (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
            m_storage.m_data.array[1];
    pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array + 1;
    if ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1))) {
      dVar4 = (this->orientationVector_).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.m_data.array[2]
      ;
      pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array + 2;
      if ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1))) {
        local_28 = (this->quaternion_).m_coeffs.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.m_storage.m_data.
                   array[0];
        dStack_20 = (this->quaternion_).m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.m_storage.m_data.
                    array[1];
        goto LAB_00156a29;
      }
    }
  }
  dVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[0] =
       (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[1] = dVar4;
  local_40 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[2] = local_40;
  auVar5 = *(undefined1 (*) [16])
            (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  ;
  dVar6 = local_40 * local_40 + auVar5._8_8_ * auVar5._8_8_ + auVar5._0_8_ * auVar5._0_8_;
  dVar4 = SQRT(dVar6);
  if (9.999999999999999e-33 < dVar6) {
    auVar3._8_8_ = dVar4;
    auVar3._0_8_ = dVar4;
    auVar5 = divpd(auVar5,auVar3);
    local_40 = local_40 / dVar4;
  }
  else {
    auVar5 = ZEXT816(0);
    local_40 = 1.0;
  }
  dVar4 = (double)(-(ulong)(9.999999999999999e-33 < dVar6) & (ulong)(dVar4 * 0.5));
  dVar6 = cos(dVar4);
  (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
  m_storage.m_data.array[3] = dVar6;
  dVar4 = sin(dVar4);
  local_28 = auVar5._0_8_;
  dStack_20 = auVar5._8_8_;
  local_28 = dVar4 * local_28;
  dStack_20 = dVar4 * dStack_20;
  auVar5._8_4_ = SUB84(dStack_20,0);
  auVar5._0_8_ = local_28;
  auVar5._12_4_ = (int)((ulong)dStack_20 >> 0x20);
  *(undefined1 (*) [16])
   (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
   m_storage.m_data.array = auVar5;
  (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
  m_storage.m_data.array[2] = local_40 * dVar4;
LAB_00156a29:
  auVar2._8_4_ = SUB84(dStack_20,0);
  auVar2._0_8_ = local_28;
  auVar2._12_4_ = (int)((ulong)dStack_20 >> 0x20);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
   m_storage.m_data.array = auVar2;
  dVar4 = (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
          m_storage.m_data.array[3];
  (__return_storage_ptr__->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] =
       (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
       m_storage.m_data.array[2];
  (__return_storage_ptr__->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

Quaternion StableIMUFixedContactDynamicalSystem::computeQuaternion_(const Vector3 & x)
{
  if(orientationVector_ != x)
  {
    orientationVector_ = x;
    quaternion_ = kine::rotationVectorToAngleAxis(x);
  }

  return quaternion_;
}